

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O2

CFavoriteServer * __thiscall
CServerBrowserFavorites::FindFavoriteByHostname
          (CServerBrowserFavorites *this,char *pHostname,int *Index)

{
  int iVar1;
  CServerBrowserFavorites *b;
  int i;
  long lVar2;
  
  lVar2 = 0;
  b = this;
  while( true ) {
    if (this->m_NumFavoriteServers <= lVar2) {
      return (CFavoriteServer *)0x0;
    }
    iVar1 = str_comp(pHostname,(char *)b);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
    b = (CServerBrowserFavorites *)(b->m_aFavoriteServers + 1);
  }
  if (Index == (int *)0x0) {
    return b->m_aFavoriteServers;
  }
  *Index = (int)lVar2;
  return b->m_aFavoriteServers;
}

Assistant:

CServerBrowserFavorites::CFavoriteServer *CServerBrowserFavorites::FindFavoriteByHostname(const char *pHostname, int *Index)
{
	for(int i = 0; i < m_NumFavoriteServers; i++)
	{
		if(str_comp(pHostname, m_aFavoriteServers[i].m_aHostname) == 0)
		{
			if(Index)
				*Index = i;
			return &m_aFavoriteServers[i];
		}
	}

	return 0;
}